

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::handle_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  char *length;
  long in_RCX;
  long in_RDX;
  ClientImpl *in_RDI;
  byte in_R8B;
  int __flags;
  undefined4 *in_R9;
  bool bVar4;
  Error *in_stack_00000040;
  Response *in_stack_00000048;
  Request *in_stack_00000050;
  ClientImpl *in_stack_00000058;
  Response new_res;
  Request new_req;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  auth;
  string *password;
  string *username;
  bool is_proxy;
  Request req2;
  bool ret;
  Request req_save;
  Request *in_stack_fffffffffffff648;
  uint in_stack_fffffffffffff650;
  undefined4 in_stack_fffffffffffff654;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff658;
  allocator<char> *in_stack_fffffffffffff680;
  char *in_stack_fffffffffffff688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_stack_fffffffffffff698;
  Response *local_948;
  undefined6 in_stack_fffffffffffff6c8;
  undefined1 in_stack_fffffffffffff6ce;
  undefined1 in_stack_fffffffffffff6cf;
  Request *in_stack_fffffffffffff6d0;
  undefined1 local_918 [200];
  Error *in_stack_fffffffffffff7b0;
  undefined1 in_stack_fffffffffffff7bf;
  Response *in_stack_fffffffffffff7c0;
  Request *in_stack_fffffffffffff7c8;
  Stream *in_stack_fffffffffffff7d0;
  ClientImpl *in_stack_fffffffffffff7d8;
  string local_808 [103];
  allocator<char> local_7a1;
  string local_7a0 [32];
  undefined1 local_780 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  undefined1 in_stack_fffffffffffff8ef;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff8f0;
  Response *in_stack_fffffffffffff8f8;
  string local_500 [32];
  undefined1 local_4e0 [623];
  byte local_271;
  string local_250 [536];
  undefined4 *local_38;
  byte local_29;
  long local_28;
  long local_20;
  byte local_1;
  
  local_29 = in_R8B & 1;
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    Request::Request(in_stack_fffffffffffff6d0,
                     (Request *)
                     CONCAT17(in_stack_fffffffffffff6cf,
                              CONCAT16(in_stack_fffffffffffff6ce,in_stack_fffffffffffff6c8)));
    uVar2 = (*in_RDI->_vptr_ClientImpl[6])();
    if ((((uVar2 & 1) == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
       (in_RDI->proxy_port_ != -1)) {
      Request::Request(in_stack_fffffffffffff6d0,
                       (Request *)
                       CONCAT17(in_stack_fffffffffffff6cf,
                                CONCAT16(in_stack_fffffffffffff6ce,in_stack_fffffffffffff6c8)));
      std::operator+(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
      std::operator+(in_stack_fffffffffffff658,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
      in_stack_fffffffffffff6d0 = (Request *)local_4e0;
      std::__cxx11::string::operator=
                ((string *)(local_4e0 + 0x40),(string *)in_stack_fffffffffffff6d0);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffff6d0);
      std::__cxx11::string::~string(local_500);
      local_271 = process_request(in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
                                  in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                                  (bool)in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b0);
      Request::operator=((Request *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                         in_stack_fffffffffffff648);
      std::__cxx11::string::operator=((string *)(local_20 + 0x20),local_250);
      Request::~Request((Request *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
    }
    else {
      in_stack_fffffffffffff6cf =
           process_request(in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
                           in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                           (bool)in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b0);
      local_271 = in_stack_fffffffffffff6cf;
    }
    if ((local_271 & 1) == 0) {
      local_1 = 0;
    }
    else {
      if (((300 < *(int *)(local_28 + 0x20)) && (*(int *)(local_28 + 0x20) < 400)) &&
         ((in_RDI->follow_location_ & 1U) != 0)) {
        Request::operator=((Request *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                           in_stack_fffffffffffff648);
        in_stack_fffffffffffff6ce =
             redirect(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040);
        local_271 = in_stack_fffffffffffff6ce;
      }
      if (((*(int *)(local_28 + 0x20) == 0x191) || (*(int *)(local_28 + 0x20) == 0x197)) &&
         (*(ulong *)(local_20 + 0x230) < 5)) {
        bVar4 = *(int *)(local_28 + 0x20) == 0x197;
        if (bVar4) {
          local_948 = (Response *)&in_RDI->proxy_digest_auth_password_;
        }
        else {
          local_948 = (Response *)&in_RDI->digest_auth_password_;
        }
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0x16a6d9);
          bVar1 = detail::parse_www_authenticate
                            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
                             (bool)in_stack_fffffffffffff8ef);
          if (bVar1) {
            Request::Request(in_stack_fffffffffffff6d0,
                             (Request *)
                             CONCAT17(in_stack_fffffffffffff6cf,
                                      CONCAT16(in_stack_fffffffffffff6ce,in_stack_fffffffffffff6c8))
                            );
            this_00 = &local_740;
            length = "Authorization";
            if (bVar4) {
              length = "Proxy-Authorization";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_00,in_stack_fffffffffffff688,in_stack_fffffffffffff680);
            std::
            multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::erase((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                    &in_stack_fffffffffffff648->method);
            std::__cxx11::string::~string(local_7a0);
            std::allocator<char>::~allocator(&local_7a1);
            detail::random_string_abi_cxx11_((size_t)length);
            in_stack_fffffffffffff650 = (uint)bVar4;
            __flags = (int)local_808;
            detail::make_digest_authentication_header
                      ((Request *)new_req.remote_addr.field_2._M_allocated_capacity,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)new_req.remote_addr._M_string_length,new_req.remote_addr._0_8_,
                       (string *)new_req.body.field_2._8_8_,
                       (string *)new_req.body.field_2._M_allocated_capacity,
                       (string *)new_req.version._0_8_,new_req.body._M_string_length._7_1_);
            std::
            multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_948,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x16a854);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
            std::__cxx11::string::~string(local_808);
            Response::Response((Response *)
                               CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
            uVar3 = send(in_RDI,(int)local_780,local_918,(size_t)local_38,__flags);
            local_271 = (byte)uVar3 & 1;
            if ((uVar3 & 1) != 0) {
              Response::operator=((Response *)
                                  CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                                  local_948);
            }
            Response::~Response((Response *)
                                CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
            Request::~Request((Request *)
                              CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x16aa0f);
        }
      }
      local_1 = local_271 & 1;
    }
    Request::~Request((Request *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
  }
  else {
    *local_38 = 2;
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

inline bool ClientImpl::handle_request(Stream& strm, Request& req,
        Response& res, bool close_connection,
        Error& error) {
        if (req.path.empty()) {
            error = Error::Connection;
            return false;
        }

        auto req_save = req;

        bool ret;

        if (!is_ssl() && !proxy_host_.empty() && proxy_port_ != -1) {
            auto req2 = req;
            req2.path = "http://" + host_and_port_ + req.path;
            ret = process_request(strm, req2, res, close_connection, error);
            req = req2;
            req.path = req_save.path;
        } else {
            ret = process_request(strm, req, res, close_connection, error);
        }

        if (!ret) { return false; }

        if (300 < res.status && res.status < 400 && follow_location_) {
            req = req_save;
            ret = redirect(req, res, error);
        }

    #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
        if ((res.status == 401 || res.status == 407) &&
            req.authorization_count_ < 5) {
            auto is_proxy = res.status == 407;
            const auto& username =
                is_proxy ? proxy_digest_auth_username_ : digest_auth_username_;
            const auto& password =
                is_proxy ? proxy_digest_auth_password_ : digest_auth_password_;

            if (!username.empty() && !password.empty()) {
                std::map<std::string, std::string> auth;
                if (detail::parse_www_authenticate(res, auth, is_proxy)) {
                    Request new_req = req;
                    new_req.authorization_count_ += 1;
                    new_req.headers.erase(is_proxy ? "Proxy-Authorization"
                        : "Authorization");
                    new_req.headers.insert(detail::make_digest_authentication_header(
                        req, auth, new_req.authorization_count_, detail::random_string(10),
                        username, password, is_proxy));

                    Response new_res;

                    ret = send(new_req, new_res, error);
                    if (ret) { res = new_res; }
                }
            }
        }
    #endif

        return ret;
    }